

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O1

char * get_absolute_path(char *path,econf_err *error)

{
  char *pcVar1;
  econf_err eVar2;
  
  if (*path == '/') {
    pcVar1 = strdup(path);
  }
  else {
    pcVar1 = realpath(path,(char *)0x0);
    if (pcVar1 == (char *)0x0) {
      eVar2 = ECONF_NOFILE;
      pcVar1 = (char *)0x0;
      if (error == (econf_err *)0x0) {
        return (char *)0x0;
      }
      goto LAB_001060d4;
    }
  }
  eVar2 = ECONF_NOMEM;
  if (error == (econf_err *)0x0 || pcVar1 != (char *)0x0) {
    return pcVar1;
  }
LAB_001060d4:
  *error = eVar2;
  return pcVar1;
}

Assistant:

char *get_absolute_path(const char *path, econf_err *error) {
  char *absolute_path;
  if(*path != '/') {
    absolute_path = realpath(path, NULL);
    if(absolute_path == NULL) {
      if (error)
	*error = ECONF_NOFILE;
      return NULL;
    }
  } else {
    absolute_path = strdup(path);
  }
  if (absolute_path == NULL && error)
    *error = ECONF_NOMEM;

  return absolute_path;
}